

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testGroupStarting(TeamCityReporter *this,GroupInfo *groupInfo)

{
  ostream *poVar1;
  StreamingReporterBase<Catch::TeamCityReporter> *in_RDI;
  string *in_stack_000001f8;
  GroupInfo *in_stack_ffffffffffffff98;
  string local_30 [48];
  
  StreamingReporterBase<Catch::TeamCityReporter>::testGroupStarting
            (in_RDI,in_stack_ffffffffffffff98);
  poVar1 = std::operator<<(in_RDI->stream,"##teamcity[testSuiteStarted name=\'");
  escape(in_stack_000001f8);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void testGroupStarting( GroupInfo const& groupInfo ) override {
            StreamingReporterBase::testGroupStarting( groupInfo );
            stream << "##teamcity[testSuiteStarted name='"
                << escape( groupInfo.name ) << "']\n";
        }